

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineSplitter.h
# Opt level: O0

char * __thiscall Assimp::LineSplitter::operator[](LineSplitter *this,size_t idx)

{
  bool bVar1;
  range_error *this_00;
  char *local_28;
  size_t i;
  char *s;
  size_t idx_local;
  LineSplitter *this_local;
  
  s = (char *)idx;
  idx_local = (size_t)this;
  operator->[abi_cxx11_(this);
  i = std::__cxx11::string::c_str();
  SkipSpaces<char>((char **)&i);
  local_28 = (char *)0x0;
  do {
    if (s <= local_28) {
      return (char *)i;
    }
    while (bVar1 = IsSpace<char>(*(char *)i), ((bVar1 ^ 0xffU) & 1) != 0) {
      bVar1 = IsLineEnd<char>(*(char *)i);
      if (bVar1) {
        this_00 = (range_error *)__cxa_allocate_exception(0x10);
        std::range_error::range_error(this_00,"Token index out of range, EOL reached");
        __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
      }
      i = i + 1;
    }
    SkipSpaces<char>((char **)&i);
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

AI_FORCE_INLINE
const char *LineSplitter::operator[] (size_t idx) const {
    const char* s = operator->()->c_str();

    SkipSpaces(&s);
    for (size_t i = 0; i < idx; ++i) {

        for (; !IsSpace(*s); ++s) {
            if (IsLineEnd(*s)) {
                throw std::range_error("Token index out of range, EOL reached");
            }
        }
        SkipSpaces(&s);
    }
    return s;
}